

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.cpp
# Opt level: O0

Result __thiscall Kernel::Ordering::getEqualityArgumentOrder(Ordering *this,Literal *eq)

{
  uint64_t uVar1;
  Ordering *pOVar2;
  TermList *pTVar3;
  Term *in_RSI;
  Ordering *in_RDI;
  ArgumentOrderVals precomputed;
  Result res;
  Term *this_00;
  Result local_2c;
  Result local_4;
  
  pOVar2 = tryGetGlobalOrdering();
  if (pOVar2 == in_RDI) {
    local_2c = Term::getArgumentOrderValue((Term *)0x8b4594);
    if (local_2c == 0) {
      pTVar3 = Term::nthArgument(in_RSI,0);
      uVar1 = pTVar3->_content;
      pTVar3 = Term::nthArgument(in_RSI,1);
      this_00 = (Term *)pTVar3->_content;
      local_2c = (*in_RDI->_vptr_Ordering[3])(in_RDI,uVar1,this_00);
      Term::setArgumentOrderValue(this_00,(ArgumentOrderVals)((ulong)in_RDI >> 0x20));
    }
    local_4 = local_2c;
  }
  else {
    pTVar3 = Term::nthArgument(in_RSI,0);
    uVar1 = pTVar3->_content;
    pTVar3 = Term::nthArgument(in_RSI,1);
    local_4 = (*in_RDI->_vptr_Ordering[3])(in_RDI,uVar1,pTVar3->_content);
  }
  return local_4;
}

Assistant:

Ordering::Result Ordering::getEqualityArgumentOrder(Literal* eq) const
{
  ASS(eq->isEquality());

  if(tryGetGlobalOrdering()!=this) {
    return compare(*eq->nthArgument(0), *eq->nthArgument(1));
  }

  Result res;
  ArgumentOrderVals precomputed = static_cast<ArgumentOrderVals>(eq->getArgumentOrderValue());
  if(precomputed!=AO_UNKNOWN) {
    res = static_cast<Result>(precomputed);
    ASS_EQ(res, compare(*eq->nthArgument(0), *eq->nthArgument(1)));
  }
  else {
    res = compare(*eq->nthArgument(0), *eq->nthArgument(1));
    eq->setArgumentOrderValue(static_cast<ArgumentOrderVals>(res));
  }
  return res;
}